

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  pointer puVar1;
  cmake *this_00;
  string *psVar2;
  unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
  *entry;
  pointer puVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string text;
  ostringstream conflicts;
  long *local_280;
  long local_278;
  long local_270 [2];
  string local_260;
  undefined1 local_240 [280];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_240 + 0xa8));
  puVar3 = (this->ImplicitDirEntries).
           super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->ImplicitDirEntries).
           super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      cmOrderDirectoriesConstraint::FindImplicitConflicts
                ((puVar3->_M_t).
                 super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
                 .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl,
                 (ostringstream *)(local_240 + 0xa8));
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  std::__cxx11::stringbuf::str();
  if (local_278 != 0) {
    this_00 = this->GlobalGenerator->CMakeInstance;
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_240._0_8_ = (element_type *)0x17;
    local_240._8_8_ = "Cannot generate a safe ";
    local_240._16_8_ = (cmLocalGenerator *)0x0;
    local_240._32_8_ = (this->Purpose)._M_dataplus._M_p;
    local_240._24_8_ = (this->Purpose)._M_string_length;
    local_240._40_8_ = 0;
    local_240._48_8_ = 0xc;
    local_240._56_8_ = (long)" set to OLD for target " + 0xb;
    local_240._64_8_ = 0;
    local_240._80_8_ = (psVar2->_M_dataplus)._M_p;
    local_240._72_8_ = psVar2->_M_string_length;
    local_240._88_8_ = (_Base_ptr)0x0;
    local_240._96_8_ = (_Base_ptr)0x59;
    local_240._104_8_ =
         " because files in some directories may conflict with  libraries in implicit directories:\n"
    ;
    local_240._112_8_ = 0;
    local_240._136_8_ = (_Base_ptr)0x0;
    local_240._144_8_ = (_Base_ptr)0x33;
    local_240._152_8_ = "Some of these libraries may not be found correctly.";
    local_240._160_8_ = 0;
    views._M_len = 7;
    views._M_array = (iterator)local_240;
    cmCatViews(&local_260,views);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_240);
    cmake::IssueMessage(this_00,WARNING,&local_260,(cmListFileBacktrace *)local_240);
    if ((cmMakefile *)local_240._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_240 + 0xa8));
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for (const auto& entry : this->ImplicitDirEntries) {
    entry->FindImplicitConflicts(conflicts);
  }

  // Skip warning if there were no conflicts.
  std::string const text = conflicts.str();
  if (text.empty()) {
    return;
  }

  // Warn about the conflicts.
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING,
    cmStrCat("Cannot generate a safe ", this->Purpose, " for target ",
             this->Target->GetName(),
             " because files in some directories may "
             "conflict with  libraries in implicit directories:\n",
             text, "Some of these libraries may not be found correctly."),
    this->Target->GetBacktrace());
}